

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O0

int CfdVerifyConfidentialTxSignature
              (void *handle,char *tx_hex,char *signature,char *pubkey,char *script,char *txid,
              uint32_t vout,int sighash_type,bool sighash_anyone_can_pay,int64_t value_satoshi,
              char *value_commitment,int witness_version)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined8 uVar4;
  char *in_RCX;
  char *in_RDX;
  Script *in_RSI;
  char *in_R8;
  char *in_R9;
  Amount AVar5;
  uint8_t in_stack_00000010;
  byte in_stack_00000018;
  int64_t in_stack_00000020;
  char *in_stack_00000028;
  undefined4 in_stack_00000030;
  CfdException *except;
  exception *std_except;
  ConfidentialValue value;
  SigHashType sighash_type_obj;
  Txid txid_obj;
  ByteData signature_obj;
  ConfidentialTransactionController ctxc;
  bool work_result;
  ConfidentialTransactionController *in_stack_fffffffffffffb20;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffb28;
  undefined4 in_stack_fffffffffffffb2c;
  ConfidentialTransactionController *in_stack_fffffffffffffb30;
  CfdError in_stack_fffffffffffffb3c;
  undefined4 in_stack_fffffffffffffb40;
  undefined4 in_stack_fffffffffffffb44;
  Script *script_00;
  allocator *paVar7;
  uint32_t vout_00;
  Txid *in_stack_fffffffffffffbd8;
  Pubkey *in_stack_fffffffffffffbe0;
  undefined7 in_stack_fffffffffffffbe8;
  ConfidentialTransactionController *in_stack_fffffffffffffbf0;
  undefined7 in_stack_fffffffffffffc00;
  WitnessVersion version;
  ConfidentialValue *in_stack_fffffffffffffc08;
  WitnessVersion in_stack_fffffffffffffc10;
  SigHashType local_3c8;
  allocator local_3b9;
  string local_3b8;
  Pubkey local_398;
  SigHashType local_380;
  allocator local_371;
  string local_370;
  Script local_350;
  allocator local_311;
  string local_310;
  Pubkey local_2f0;
  int64_t local_2d8;
  undefined1 local_2d0;
  Amount local_2c8;
  ConfidentialValue local_2b8;
  allocator local_289;
  string local_288;
  ConfidentialValue local_268;
  undefined1 local_240 [55];
  allocator local_209;
  string local_208;
  Txid local_1e8;
  allocator local_1c1;
  string local_1c0;
  ByteData local_1a0;
  allocator local_181;
  string local_180 [118];
  undefined1 local_10a;
  allocator local_109;
  string local_108 [32];
  CfdSourceLocation local_e8;
  undefined1 local_ca;
  allocator local_c9;
  string local_c8 [32];
  CfdSourceLocation local_a8;
  undefined1 local_8a;
  allocator local_89;
  string local_88 [32];
  CfdSourceLocation local_68;
  byte local_3a;
  byte local_39;
  char *local_38;
  char *local_30;
  char *local_28;
  char *local_20;
  Script *local_18;
  int local_4;
  
  local_39 = in_stack_00000018 & 1;
  local_3a = 0;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString((char *)local_18);
  if (bVar1) {
    local_68.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                 ,0x2f);
    local_68.filename = local_68.filename + 1;
    local_68.line = 0x839;
    local_68.funcname = "CfdVerifyConfidentialTxSignature";
    cfd::core::logger::warn<>(&local_68,"tx is null or empty.");
    local_8a = 1;
    uVar4 = __cxa_allocate_exception(0x30);
    paVar7 = &local_89;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"Failed to parameter. tx is null or empty.",paVar7);
    cfd::core::CfdException::CfdException
              ((CfdException *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
               in_stack_fffffffffffffb3c,(string *)in_stack_fffffffffffffb30);
    local_8a = 0;
    __cxa_throw(uVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  uVar2 = cfd::capi::IsEmptyString(local_20);
  if ((bool)uVar2) {
    local_a8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                 ,0x2f);
    local_a8.filename = local_a8.filename + 1;
    local_a8.line = 0x83f;
    local_a8.funcname = "CfdVerifyConfidentialTxSignature";
    cfd::core::logger::warn<>(&local_a8,"signature is null or empty.");
    local_ca = 1;
    uVar4 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_c8,"Failed to parameter. signature is null or empty.",&local_c9);
    cfd::core::CfdException::CfdException
              ((CfdException *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
               in_stack_fffffffffffffb3c,(string *)in_stack_fffffffffffffb30);
    local_ca = 0;
    __cxa_throw(uVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  uVar3 = cfd::capi::IsEmptyString(local_28);
  if ((bool)uVar3) {
    local_e8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                 ,0x2f);
    local_e8.filename = local_e8.filename + 1;
    local_e8.line = 0x845;
    local_e8.funcname = "CfdVerifyConfidentialTxSignature";
    cfd::core::logger::warn<>(&local_e8,"pubkey is null or empty.");
    local_10a = 1;
    uVar4 = __cxa_allocate_exception(0x30);
    paVar7 = &local_109;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,"Failed to parameter. pubkey is null or empty.",paVar7);
    cfd::core::CfdException::CfdException
              ((CfdException *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
               in_stack_fffffffffffffb3c,(string *)in_stack_fffffffffffffb30);
    local_10a = 0;
    __cxa_throw(uVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  paVar7 = &local_181;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,(char *)local_18,paVar7);
  vout_00 = (uint32_t)((ulong)paVar7 >> 0x20);
  cfd::ConfidentialTransactionController::ConfidentialTransactionController
            (in_stack_fffffffffffffb30,
             (string *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1c0,local_20,&local_1c1);
  cfd::core::ByteData::ByteData(&local_1a0,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_208,local_38,&local_209);
  cfd::core::Txid::Txid(&local_1e8,&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  cfd::core::SigHashType::Create
            ((SigHashType *)(local_240 + 0x28),in_stack_00000010,(bool)(local_39 & 1),false);
  cfd::core::ConfidentialValue::ConfidentialValue((ConfidentialValue *)local_240);
  bVar1 = cfd::capi::IsEmptyString(in_stack_00000028);
  if (bVar1) {
    AVar5 = cfd::core::Amount::CreateBySatoshiAmount(in_stack_00000020);
    local_2d8 = AVar5.amount_;
    local_2d0 = AVar5.ignore_check_;
    local_2c8.amount_ = local_2d8;
    local_2c8.ignore_check_ = (bool)local_2d0;
    cfd::core::ConfidentialValue::ConfidentialValue(&local_2b8,&local_2c8);
    cfd::core::ConfidentialValue::operator=((ConfidentialValue *)local_240,&local_2b8);
    cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x5b8a58);
    script_00 = local_18;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_288,in_stack_00000028,&local_289);
    cfd::core::ConfidentialValue::ConfidentialValue(&local_268,&local_288);
    cfd::core::ConfidentialValue::operator=((ConfidentialValue *)local_240,&local_268);
    cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x5b8837);
    std::__cxx11::string::~string((string *)&local_288);
    std::allocator<char>::~allocator((allocator<char> *)&local_289);
    script_00 = local_18;
  }
  bVar1 = cfd::capi::IsEmptyString(local_30);
  if (bVar1) {
    bVar1 = cfd::capi::IsEmptyString(local_28);
    version = (WitnessVersion)in_stack_fffffffffffffc08;
    if (!bVar1) {
      std::allocator<char>::allocator();
      uVar6 = (undefined4)((ulong)in_stack_fffffffffffffb20 >> 0x20);
      std::__cxx11::string::string((string *)&local_3b8,local_28,&local_3b9);
      cfd::core::Pubkey::Pubkey(&local_398,&local_3b8);
      cfd::core::SigHashType::SigHashType(&local_3c8,(SigHashType *)(local_240 + 0x28));
      in_stack_fffffffffffffb20 =
           (ConfidentialTransactionController *)CONCAT44(uVar6,in_stack_00000030);
      local_3a = cfd::ConfidentialTransactionController::VerifyInputSignature
                           (in_stack_fffffffffffffbf0,
                            (ByteData *)CONCAT17(uVar3,in_stack_fffffffffffffbe8),
                            in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,vout_00,
                            (SigHashType *)script_00,
                            (ConfidentialValue *)CONCAT17(uVar2,in_stack_fffffffffffffc00),version);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x5b8ddb);
      std::__cxx11::string::~string((string *)&local_3b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_310,local_28,&local_311);
    cfd::core::Pubkey::Pubkey(&local_2f0,&local_310);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_370,local_30,&local_371);
    cfd::core::Script::Script(&local_350,&local_370);
    cfd::core::SigHashType::SigHashType(&local_380,(SigHashType *)(local_240 + 0x28));
    in_stack_fffffffffffffb20 = (ConfidentialTransactionController *)local_240;
    local_3a = cfd::ConfidentialTransactionController::VerifyInputSignature
                         (in_stack_fffffffffffffbf0,
                          (ByteData *)CONCAT17(uVar3,in_stack_fffffffffffffbe8),
                          in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,vout_00,script_00,
                          (SigHashType *)CONCAT17(uVar2,in_stack_fffffffffffffc00),
                          in_stack_fffffffffffffc08,in_stack_fffffffffffffc10);
    cfd::core::Script::~Script((Script *)in_stack_fffffffffffffb20);
    std::__cxx11::string::~string((string *)&local_370);
    std::allocator<char>::~allocator((allocator<char> *)&local_371);
    cfd::core::Pubkey::~Pubkey((Pubkey *)0x5b8bfe);
    std::__cxx11::string::~string((string *)&local_310);
    std::allocator<char>::~allocator((allocator<char> *)&local_311);
  }
  if ((local_3a & 1) == 0) {
    local_4 = 7;
  }
  else {
    local_4 = 0;
  }
  cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x5b8ea7);
  cfd::core::Txid::~Txid((Txid *)0x5b8eb4);
  cfd::core::ByteData::~ByteData((ByteData *)0x5b8ec1);
  cfd::ConfidentialTransactionController::~ConfidentialTransactionController
            (in_stack_fffffffffffffb20);
  return local_4;
}

Assistant:

CFDC_API int CfdVerifyConfidentialTxSignature(
    void* handle, const char* tx_hex, const char* signature,
    const char* pubkey, const char* script, const char* txid, uint32_t vout,
    int sighash_type, bool sighash_anyone_can_pay, int64_t value_satoshi,
    const char* value_commitment, int witness_version) {
  bool work_result = false;
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (IsEmptyString(signature)) {
      warn(CFD_LOG_SOURCE, "signature is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. signature is null or empty.");
    }
    if (IsEmptyString(pubkey)) {
      warn(CFD_LOG_SOURCE, "pubkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null or empty.");
    }

    ConfidentialTransactionController ctxc(tx_hex);
    ByteData signature_obj(signature);
    Txid txid_obj(txid);
    SigHashType sighash_type_obj = SigHashType::Create(
        static_cast<uint8_t>(sighash_type), sighash_anyone_can_pay);
    ConfidentialValue value;
    if (!IsEmptyString(value_commitment)) {
      value = ConfidentialValue(value_commitment);
    } else {
      value = ConfidentialValue(Amount::CreateBySatoshiAmount(value_satoshi));
    }

    if (!IsEmptyString(script)) {
      work_result = ctxc.VerifyInputSignature(
          signature_obj, Pubkey(pubkey), txid_obj, vout, Script(script),
          sighash_type_obj, value,
          static_cast<WitnessVersion>(witness_version));
    } else if (!IsEmptyString(pubkey)) {
      work_result = ctxc.VerifyInputSignature(
          signature_obj, Pubkey(pubkey), txid_obj, vout, sighash_type_obj,
          value, static_cast<WitnessVersion>(witness_version));
    }

    if (!work_result) {
      return CfdErrorCode::kCfdSignVerificationError;
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}